

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.h
# Opt level: O2

_Bool bitset_for_each(bitset_t *b,bitset_iterator iterator,void *ptr)

{
  ulong uVar1;
  ulong uVar2;
  _Bool _Var3;
  ulong uVar4;
  ulong uVar5;
  uint64_t uVar6;
  
  uVar5 = 0;
  for (uVar4 = 0; uVar1 = b->arraysize, uVar4 < uVar1; uVar4 = uVar4 + 1) {
    uVar6 = b->array[uVar4];
    while (uVar6 != 0) {
      uVar2 = 0;
      if (uVar6 != 0) {
        for (; (uVar6 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      _Var3 = (*iterator)(uVar2 | uVar5,ptr);
      uVar6 = uVar6 & uVar6 - 1;
      if (!_Var3) goto LAB_0010c65c;
    }
    uVar5 = uVar5 + 0x40;
  }
LAB_0010c65c:
  return uVar1 <= uVar4;
}

Assistant:

inline bool bitset_for_each(const bitset_t *b, bitset_iterator iterator,
                            void *ptr) {
    size_t base = 0;
    for (size_t i = 0; i < b->arraysize; ++i) {
        uint64_t w = b->array[i];
        while (w != 0) {
            uint64_t t = w & (~w + 1);
            int r = roaring_trailing_zeroes(w);
            if (!iterator(r + base, ptr)) return false;
            w ^= t;
        }
        base += 64;
    }
    return true;
}